

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec10.c
# Opt level: O2

int If_Dec10Perform(word *pF,int nVars,int fDerive)

{
  byte bVar1;
  uint v;
  uint v_00;
  uint v_01;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  uint v_02;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  word Mask;
  long lVar12;
  ulong uVar13;
  int Var2Pla [10];
  int Pla2Var [10];
  ulong local_848 [16];
  word pCof1 [16];
  int Count [210];
  word pCof0 [16];
  int Masks [210];
  
  if (4 < nVars - 6U) {
    __assert_fail("nVars >= 6 && nVars <= 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0x184,"int If_Dec10Perform(word *, int, int)");
  }
  for (uVar13 = 0; (uint)nVars != uVar13; uVar13 = uVar13 + 1) {
    iVar4 = (int)uVar13;
    iVar2 = If_Dec10HasVar(pF,nVars,iVar4);
    if (iVar2 == 0) {
      __assert_fail("If_Dec10HasVar( pF, nVars, i )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                    ,0x188,"int If_Dec10Perform(word *, int, int)");
    }
    Var2Pla[uVar13] = iVar4;
    Pla2Var[uVar13] = iVar4;
  }
  bVar7 = (byte)(nVars + -4);
  bVar1 = bVar7 & 0x1f;
  uVar13 = ~(-1L << ((byte)(1 << bVar1) & 0x3f));
  if (nVars == 10) {
    uVar13 = 0xffffffffffffffff;
  }
  uVar9 = 0;
  uVar10 = 0 << bVar1;
  while (v = uVar10, v != nVars) {
    uVar10 = v + 1;
    while (v_00 = uVar10, uVar10 = v + 1, v_00 != nVars) {
      uVar10 = v_00 + 1;
      while (v_01 = uVar10, uVar10 = v_00 + 1, (int)v_01 < nVars) {
        uVar9 = (ulong)(int)uVar9;
        for (v_02 = v_01 + 1; uVar10 = v_01 + 1, (int)v_02 < nVars; v_02 = v_02 + 1) {
          If_Dec10MoveTo(pF,nVars,v,nVars + -1,Pla2Var,Var2Pla);
          If_Dec10MoveTo(pF,nVars,v_00,nVars + -2,Pla2Var,Var2Pla);
          If_Dec10MoveTo(pF,nVars,v_01,nVars + -3,Pla2Var,Var2Pla);
          If_Dec10MoveTo(pF,nVars,v_02,nVars + -4,Pla2Var,Var2Pla);
          uVar5 = 0xffffffffffffffff;
          while (uVar5 - (uint)nVars != -1) {
            lVar6 = uVar5 + 1;
            uVar5 = uVar5 + 1;
            if (uVar5 != (uint)Pla2Var[Var2Pla[lVar6]]) {
              __assert_fail("Pla2Var[Var2Pla[i]] == i",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                            ,0x17c,"void If_DecVerifyPerm(int *, int *, int)");
            }
          }
          local_848[0] = *pF & uVar13;
          uVar10 = 1;
          for (iVar2 = 1; iVar2 != 0x10; iVar2 = iVar2 + 1) {
            bVar1 = bVar7 & 0x1f;
            uVar3 = iVar2 << bVar1;
            uVar11 = pF[uVar3 >> 6] >> ((byte)uVar3 & 0x3f) & uVar13;
            uVar5 = 0;
            if (0 < (int)uVar10) {
              uVar5 = (ulong)uVar10;
            }
            for (uVar8 = (ulong)(uint)(0 << bVar1); uVar5 != uVar8; uVar8 = uVar8 + 1) {
              if (uVar11 == local_848[uVar8]) {
                uVar5 = uVar8 & 0xffffffff;
                break;
              }
            }
            if ((uint)uVar5 == uVar10) {
              lVar6 = (long)(int)uVar10;
              uVar10 = uVar10 + 1;
              local_848[lVar6] = uVar11;
            }
          }
          Count[uVar9] = uVar10;
          Masks[uVar9] = 1 << ((byte)v & 0x1f) | 1 << (v_00 & 0x1f) | 1 << (v_01 & 0x1f) |
                         1 << (v_02 & 0x1f);
          if ((int)uVar10 < 2) {
            __assert_fail("Count[v] > 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                          ,0x1a5,"int If_Dec10Perform(word *, int, int)");
          }
          if (uVar10 < 6 && uVar10 != 2) {
            for (iVar2 = -1; iVar2 != -5; iVar2 = iVar2 + -1) {
              If_Dec10Cofactors(pF,nVars,nVars + iVar2,pCof0,pCof1);
              iVar4 = If_Dec10CofCount2(pCof0,nVars);
              if ((iVar4 != 3) && (iVar4 = If_Dec10CofCount2(pCof1,nVars), iVar4 != 3)) {
                Count[uVar9] = -uVar10;
                break;
              }
            }
          }
          uVar9 = uVar9 + 1;
        }
      }
    }
  }
  iVar2 = (int)uVar9;
  if (0xd2 < iVar2) {
    __assert_fail("v <= 210",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0x1b4,"int If_Dec10Perform(word *, int, int)");
  }
  uVar13 = 0;
  if (0 < iVar2) {
    uVar13 = uVar9 & 0xffffffff;
  }
  lVar6 = 1;
  uVar9 = 0;
  do {
    if (uVar9 == uVar13) {
      return 0;
    }
    for (lVar12 = lVar6; (int)lVar12 < iVar2; lVar12 = lVar12 + 1) {
      uVar10 = Masks[lVar12] & Masks[uVar9];
      if (0xfffe < (int)uVar10) {
        __assert_fail("Num16 < (1<<16)-1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                      ,0x175,"int If_Dec10Count16(int)");
      }
      if (BitCount8[uVar10 >> 8 & 0xff] + BitCount8[uVar10 & 0xff] <= 10 - nVars) {
        iVar4 = Count[uVar9];
        if (nVars == 9) {
          if (iVar4 == 2) {
LAB_00325dd4:
            if ((Count[lVar12] == 2) || (Count[lVar12] < 0)) {
              return 1;
            }
          }
          else if (iVar4 < 0) goto LAB_00325dbe;
        }
        else if (nVars == 10) {
          if (iVar4 == 2) {
LAB_00325dbe:
            if (Count[lVar12] == 2) {
              return 1;
            }
          }
        }
        else if ((iVar4 == 2) || (iVar4 < 0)) goto LAB_00325dd4;
      }
    }
    lVar6 = lVar6 + 1;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

int If_Dec10Perform( word * pF, int nVars, int fDerive )
{ 
//    static int Cnt = 0;
    word pCof0[16], pCof1[16];
    int Pla2Var[10], Var2Pla[10], Count[210], Masks[210];
    int i, i0,i1,i2,i3, v, x;
    assert( nVars >= 6 && nVars <= 10 );
    // start arrays
    for ( i = 0; i < nVars; i++ )
    {
        assert( If_Dec10HasVar( pF, nVars, i ) );
        Pla2Var[i] = Var2Pla[i] = i;
    }
/*
    Cnt++;
//if ( Cnt == 108 )
{
printf( "%d\n", Cnt );
//Extra_PrintHex( stdout, (unsigned *)pF, nVars );
//printf( "\n" ); 
Kit_DsdPrintFromTruth( (unsigned *)pF, nVars );
printf( "\n" );
printf( "\n" );
}
*/
    // generate permutations
    v = 0;
    for ( i0 = 0;    i0 < nVars; i0++ )
    for ( i1 = i0+1; i1 < nVars; i1++ )
    for ( i2 = i1+1; i2 < nVars; i2++ )
    for ( i3 = i2+1; i3 < nVars; i3++, v++ )
    {
        If_Dec10MoveTo( pF, nVars, i0, nVars-1, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i1, nVars-2, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i2, nVars-3, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i3, nVars-4, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla, nVars );
        Count[v] = If_Dec10CofCount( pF, nVars );
        Masks[v] = (1 << i0) | (1 << i1) | (1 << i2) | (1 << i3);
        assert( Count[v] > 1 );
//printf( "%d ", Count[v] );
        if ( Count[v] == 2 || Count[v] > 5 )
            continue;
        for ( x = 0; x < 4; x++ )
        {
            If_Dec10Cofactors( pF, nVars, nVars-1-x, pCof0, pCof1 );
            if ( If_Dec10CofCount2(pCof0, nVars) <= 2 && If_Dec10CofCount2(pCof1, nVars) <= 2 )
            {
                Count[v] = -Count[v];
                break;
            }
        }
    }
//printf( "\n" );
    assert( v <= 210 );
    // check if there are compatible bound sets
    for ( i0 = 0; i0 < v; i0++ )
    for ( i1 = i0+1; i1 < v; i1++ )
    {
        if ( If_Dec10Count16(Masks[i0] & Masks[i1]) > 10 - nVars )
            continue;
        if ( nVars == 10 )
        {
            if ( Count[i0] == 2 && Count[i1] == 2 )
                return 1;
        }
        else if ( nVars == 9 )
        {
            if ( (Count[i0] == 2 && Count[i1] == 2) || 
                 (Count[i0] == 2 && Count[i1] <  0) || 
                 (Count[i0] <  0 && Count[i1] == 2) )
                return 1;
        }
        else
        {
            if ( (Count[i0] == 2 && Count[i1] == 2) || 
                 (Count[i0] == 2 && Count[i1] <  0) || 
                 (Count[i0] <  0 && Count[i1] == 2) || 
                 (Count[i0] <  0 && Count[i1] <  0) )
                return 1;
        }
    }
//    printf( "not found\n" );
    return 0;
}